

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O1

void __thiscall jessilib::thread_pool::join(thread_pool *this)

{
  pointer ptVar1;
  int iVar2;
  thread *worker;
  pointer ptVar3;
  vector<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_> *__range1;
  thread *worker_1;
  unique_lock<std::mutex> guard;
  unique_lock<std::mutex> local_40;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_threads_mutex);
  if (iVar2 == 0) {
    ptVar3 = (this->m_threads).
             super__Vector_base<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ptVar1 = (this->m_threads).
             super__Vector_base<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ptVar3 != ptVar1) {
      do {
        local_40._M_device = &ptVar3->m_notifier_mutex;
        local_40._M_owns = false;
        std::unique_lock<std::mutex>::lock(&local_40);
        local_40._M_owns = true;
        ptVar3->m_shutdown = true;
        std::unique_lock<std::mutex>::~unique_lock(&local_40);
        std::condition_variable::notify_one();
        ptVar3 = ptVar3 + 1;
      } while (ptVar3 != ptVar1);
    }
    ptVar1 = (this->m_threads).
             super__Vector_base<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ptVar3 = (this->m_threads).
                  super__Vector_base<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>
                  ._M_impl.super__Vector_impl_data._M_start; ptVar3 != ptVar1; ptVar3 = ptVar3 + 1)
    {
      std::thread::join();
    }
    std::vector<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>::
    _M_erase_at_end(&this->m_threads,
                    (this->m_threads).
                    super__Vector_base<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    if ((this->m_inactive_threads).c.
        super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        (this->m_inactive_threads).c.
        super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      do {
        std::
        deque<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>::
        pop_front(&(this->m_inactive_threads).c);
      } while ((this->m_inactive_threads).c.
               super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               (this->m_inactive_threads).c.
               super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_threads_mutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void thread_pool::join() {
	std::lock_guard<std::mutex> guard(m_threads_mutex);

	// Shutdown threads
	for (thread& worker : m_threads) {
		// Mark thread for shutdown
		{
			std::unique_lock<std::mutex> guard(worker.m_notifier_mutex);
			worker.m_shutdown = true;
		}

		// Notify thread to shutdown
		worker.m_notifier.notify_one();
	}

	// Join threads
	for (thread& worker : m_threads) {
		worker.m_thread.join();
	}

	// Cleanup threads
	m_threads.clear();
	while (!m_inactive_threads.empty()) {
		m_inactive_threads.pop();
	}
}